

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelList.hpp
# Opt level: O0

int __thiscall cali::util::ChannelList::remove(ChannelList *this,char *__filename)

{
  int iVar1;
  undefined7 extraout_var;
  element_type *extraout_RAX;
  char *__name;
  bool local_21;
  element_type *local_20;
  ChannelList *p;
  Channel *chn_local;
  ChannelList **head_local;
  undefined7 uVar2;
  
  local_20 = (this->channel).mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  __name = __filename;
  while( true ) {
    uVar2 = 0;
    local_21 = false;
    if (local_20 != (element_type *)0x0) {
      __name = __filename;
      local_21 = cali::operator!=((Channel *)local_20,(Channel *)__filename);
      uVar2 = extraout_var;
    }
    iVar1 = (int)CONCAT71(uVar2,local_21);
    if (local_21 == false) break;
    local_20 = (element_type *)(local_20->name)._M_string_length;
  }
  if (local_20 != (element_type *)0x0) {
    if (local_20 ==
        (this->channel).mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    {
      (this->channel).mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(local_20->name)._M_string_length;
    }
    unlink((ChannelList *)local_20,__name);
    if (local_20 != (element_type *)0x0) {
      ~ChannelList((ChannelList *)local_20);
      operator_delete(local_20,0x20);
      local_20 = extraout_RAX;
    }
    iVar1 = (int)local_20;
  }
  return iVar1;
}

Assistant:

inline static void remove(ChannelList** head, cali::Channel& chn)
    {
        ChannelList* p = *head;

        while (p && p->channel != chn)
            p = p->next;

        if (p) {
            if (p == *head)
                *head = p->next;

            p->unlink();
            delete p;
        }
    }